

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O2

string * ApprovalTests::HelpMessages::topAndTailHelpMessage
                   (string *__return_storage_ptr__,string *message)

{
  string lineBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string lineBreak;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::__cxx11::string::string
            ((string *)&lineBreak,
             "*****************************************************************************",
             (allocator *)&lineBuffer);
  ::std::__cxx11::string::string
            ((string *)&lineBuffer,
             "*                                                                           *\n",
             (allocator *)&local_b0);
  ::std::operator+(&local_70,&lineBreak,'\n');
  ::std::operator+(&local_50,&local_70,&lineBuffer);
  ::std::operator+(&local_30,&local_50,message);
  ::std::operator+(&local_b0,&local_30,&lineBuffer);
  ::std::operator+(__return_storage_ptr__,&local_b0,&lineBreak);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&lineBuffer);
  ::std::__cxx11::string::~string((string *)&lineBreak);
  return __return_storage_ptr__;
}

Assistant:

std::string HelpMessages::topAndTailHelpMessage(const std::string& message)
    {
        const std::string lineBreak =
            "**************************************************************"
            "***************";
        const std::string lineBuffer =
            "*                                                             "
            "              *\n";
        return lineBreak + '\n' + lineBuffer + message + lineBuffer + lineBreak;
    }